

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O1

pointer __thiscall
Eigen::aligned_allocator<ear::conversion::Sector>::allocate
          (aligned_allocator<ear::conversion::Sector> *this,size_type num,void *param_2)

{
  size_t __size;
  pointer pSVar1;
  undefined8 *puVar2;
  
  if (num < 0x2aaaaaaaaaaaaab) {
    __size = num * 0x60;
    pSVar1 = (pointer)malloc(__size);
    if (__size != 0 && ((ulong)pSVar1 & 0xf) != 0) {
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/util/Memory.h"
                    ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (__size == 0 || pSVar1 != (pointer)0x0) {
      return pSVar1;
    }
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = std::random_device::_M_fini;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

pointer allocate(size_type num, const void* /*hint*/ = 0)
  {
    internal::check_size_for_overflow<T>(num);
    return static_cast<pointer>( internal::aligned_malloc(num * sizeof(T)) );
  }